

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcGen.c
# Opt level: O0

int Gia_ManTestSatEnum(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  word *pwVar4;
  abctime aVar5;
  undefined8 uVar6;
  word *pSimInfo;
  Vec_Int_t *vVars;
  int Count;
  int iOutVar;
  int nWords;
  int iLit;
  int status;
  int v;
  int i;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  abctime clkTotal;
  abctime clk2;
  abctime clk;
  Gia_Man_t *p_local;
  
  clk = (abctime)p;
  clk2 = Abc_Clock();
  pCnf = (Cnf_Dat_t *)0x0;
  pSat = (sat_solver *)Mf_ManGenerateCnf((Gia_Man_t *)clk,8,0,0,0);
  _v = (sat_solver *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pSat,1,0);
  vVars._4_4_ = 0;
  p_00 = Vec_IntAlloc(1000);
  iOutVar = Abc_Var2Lit(1,0);
  nWords = sat_solver_addclause(_v,&iOutVar,&nWords);
  if (nWords == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcGen.c"
                  ,0x8f,"int Gia_ManTestSatEnum(Gia_Man_t *)");
  }
  Gia_ManMoFindSimulate((Gia_Man_t *)clk,1);
  aVar5 = clk;
  pObj = Gia_ManCo((Gia_Man_t *)clk,0);
  iVar1 = Gia_ObjId((Gia_Man_t *)aVar5,pObj);
  pwVar4 = Gia_ManMoObj((Gia_Man_t *)aVar5,iVar1);
  for (status = 0; status < 0x40; status = status + 1) {
    uVar2 = Abc_InfoHasBit((uint *)pwVar4,status);
    printf("%d",(ulong)uVar2);
  }
  printf("\n");
  for (status = 0; status < 0x40; status = status + 1) {
    Vec_IntClear(p_00);
    for (iLit = 0; iVar1 = iLit, iVar3 = Gia_ManObjNum((Gia_Man_t *)clk), iVar1 < iVar3;
        iLit = iLit + 1) {
      if (*(int *)(*(long *)(pSat->Mem).BookMarkE + (long)iLit * 4) != -1) {
        pwVar4 = Gia_ManMoObj((Gia_Man_t *)clk,iLit);
        iVar1 = Abc_InfoHasBit((uint *)pwVar4,status);
        if (iVar1 != 0) {
          Vec_IntPush(p_00,*(int *)(*(long *)(pSat->Mem).BookMarkE + (long)iLit * 4));
        }
      }
    }
    clkTotal = Abc_Clock();
    nWords = sat_solver_solve(_v,(lit *)0x0,(lit *)0x0,0,0,0,0);
    aVar5 = Abc_Clock();
    pCnf = (Cnf_Dat_t *)((aVar5 - clkTotal) + (long)pCnf);
    uVar6 = 0x2d;
    if (nWords == 1) {
      uVar6 = 0x2b;
    }
    printf("%c",uVar6);
    if (nWords == 1) {
      vVars._4_4_ = vVars._4_4_ + 1;
    }
  }
  printf("\n");
  printf("Finished generating %d assignments.  ",(ulong)vVars._4_4_);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - clk2);
  Abc_PrintTime(1,"SAT solver time",(abctime)pCnf);
  Vec_WrdFreeP((Vec_Wrd_t **)(clk + 0x2a8));
  Vec_IntFree(p_00);
  sat_solver_delete(_v);
  Cnf_DataFree((Cnf_Dat_t *)pSat);
  return 1;
}

Assistant:

int Gia_ManTestSatEnum( Gia_Man_t * p )
{
    abctime clk = Abc_Clock(), clk2, clkTotal = 0;
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    int i, v, status, iLit, nWords = 1, iOutVar = 1, Count = 0;
    Vec_Int_t * vVars = Vec_IntAlloc( 1000 );
    word * pSimInfo;

    // add literals to the solver
    iLit  = Abc_Var2Lit( iOutVar, 0 ); 
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );

    // simulate the AIG
    Gia_ManMoFindSimulate( p, nWords );

    // print outputs
    pSimInfo = Gia_ManMoObj( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    for ( i = 0; i < 64*nWords; i++ )
        printf( "%d", Abc_InfoHasBit( (unsigned *)pSimInfo, i ) );
    printf( "\n" );

    // iterate through the assignments
    for ( i = 0; i < 64*nWords; i++ )
    {
        Vec_IntClear( vVars );
        for ( v = 0; v < Gia_ManObjNum(p); v++ )
        {
            if ( pCnf->pVarNums[v] == -1 )
                continue;
            pSimInfo = Gia_ManMoObj( p, v );
            if ( !Abc_InfoHasBit( (unsigned *)pSimInfo, i ) )
                continue;
            Vec_IntPush( vVars, pCnf->pVarNums[v] );
        }
        //sat_solver_act_var_clear( pSat );
        //sat_solver_set_polarity( pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );

        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        clkTotal += Abc_Clock() - clk2;
        printf( "%c", status == l_True ? '+' : '-' );
        if ( status == l_True )
            Count++;
    }
    printf( "\n" );
    printf( "Finished generating %d assignments.  ", Count );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_PrintTime( 1, "SAT solver time", clkTotal );

    Vec_WrdFreeP( &p->vSims );
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return 1;
}